

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall NavierStokesBase::post_timestep(NavierStokesBase *this,int crse_iteration)

{
  MultiFab *pMVar1;
  FabArray<amrex::FArrayBox> *pFVar2;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> src;
  pointer pSVar3;
  undefined8 uVar4;
  TimeCenter TVar5;
  int iVar6;
  Periodicity *period;
  BoxArray *pBVar7;
  BoxArray *pBVar8;
  long lVar9;
  byte bVar10;
  Real RVar11;
  string name;
  DistributionMapping dm;
  char buf [64];
  BoxArray ba;
  Box bx;
  ofstream ofs;
  undefined7 uStack_3b7;
  Arena *pAStack_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8 [9];
  ios_base local_2c0 [272];
  MultiFab mf;
  
  bVar10 = 0;
  iVar6 = *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
                   field_0x8c;
  if ((this->super_AmrLevel).level == iVar6) {
    pMVar1 = this->u_mac;
    if (pMVar1 != (MultiFab *)0x0) {
      pFVar2 = pMVar1[-1].super_FabArray<amrex::FArrayBox>.os_temp._M_t.
               super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
      if (pFVar2 != (FabArray<amrex::FArrayBox> *)0x0) {
        lVar9 = (long)pFVar2 * 0x180;
        do {
          amrex::MultiFab::~MultiFab
                    ((MultiFab *)
                     ((long)&pMVar1[-1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                             _vptr_FabArrayBase + lVar9));
          lVar9 = lVar9 + -0x180;
        } while (lVar9 != 0);
      }
      operator_delete__(&pMVar1[-1].super_FabArray<amrex::FArrayBox>.os_temp,
                        (long)pFVar2 * 0x180 + 8);
    }
    this->u_mac = (MultiFab *)0x0;
  }
  if ((do_reflux != 0) && ((this->super_AmrLevel).level < iVar6)) {
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x35])(this);
  }
  if ((this->super_AmrLevel).level < iVar6) {
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x2c])(this);
  }
  if ((do_mac_proj != 0) && ((this->super_AmrLevel).level < iVar6)) {
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x34])(this);
  }
  if ((do_sync_proj != 0) && ((this->super_AmrLevel).level < iVar6)) {
    level_sync(this,crse_iteration);
  }
  if ((0 < sum_interval && (this->super_AmrLevel).level == 0) &&
     (*(((this->super_AmrLevel).parent)->level_steps).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
      sum_interval == 0)) {
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x38])(this);
  }
  lVar9 = (long)(this->super_AmrLevel).level;
  if (0 < lVar9) {
    amrex::MultiFab::Saxpy
              (&this->p_avg,
               1.0 / (double)(((this->super_AmrLevel).parent)->n_cycle).
                             super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar9],
               (MultiFab *)
               (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start[1].new_data._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0,0,1,0
              );
  }
  pBVar7 = &(this->super_AmrLevel).grids;
  pBVar8 = &this->old_intersect_new;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)&pBVar8->m_bat = *(undefined8 *)&pBVar7->m_bat;
    pBVar7 = (BoxArray *)((long)pBVar7 + (ulong)bVar10 * -0x10 + 8);
    pBVar8 = (BoxArray *)((long)pBVar8 + (ulong)bVar10 * -0x10 + 8);
  }
  (this->old_intersect_new).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->super_AmrLevel).grids.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->old_intersect_new).m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_AmrLevel).grids.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->old_intersect_new).m_simplified_list.
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_AmrLevel).grids.m_simplified_list.
       super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->old_intersect_new).m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_AmrLevel).grids.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (-1 < (anonymous_namespace)::dump_plane && (this->super_AmrLevel).level == 0) {
    bx.smallend.vect._0_8_ = *(undefined8 *)(this->super_AmrLevel).geom.domain.smallend.vect;
    uVar4 = *(undefined8 *)(this->super_AmrLevel).geom.domain.bigend.vect;
    bx.bigend.vect[0] = (int)uVar4;
    bx.bigend.vect[1] = (int)((ulong)uVar4 >> 0x20);
    bx.smallend.vect[2] = (anonymous_namespace)::dump_plane;
    bx.btype.itype =
         (uint)((ulong)*(undefined8 *)((this->super_AmrLevel).geom.domain.bigend.vect + 2) >> 0x20);
    bx.bigend.vect[2] = (anonymous_namespace)::dump_plane;
    amrex::BoxArray::BoxArray(&ba,&bx);
    amrex::DistributionMapping::DistributionMapping
              (&dm,&ba,*(int *)(amrex::ParallelContext::frames + 0x10));
    ofs = (ofstream)0x1;
    uStack_3b7 = 0;
    pAStack_3b0 = (Arena *)0x0;
    local_3a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (&mf,&ba,&dm,3,0,(MFInfo *)&ofs,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_3a8);
    src.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    period = amrex::Periodicity::NonPeriodic();
    _ofs = 0.0;
    pAStack_3b0 = (Arena *)((ulong)pAStack_3b0 & 0xffffffff00000000);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&mf.super_FabArray<amrex::FArrayBox>,
               (FabArray<amrex::FArrayBox> *)
               src.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,3,(IntVect *)&ofs,
               (IntVect *)buf,period,COPY,(CPC *)0x0,false);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) ==
        *((mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap.m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_pmap).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
      pSVar3 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar5 = amrex::StateDescriptor::timeType(pSVar3->desc);
      if (TVar5 == Point) {
        RVar11 = (pSVar3->new_time).stop;
      }
      else {
        RVar11 = ((pSVar3->new_time).start + (pSVar3->new_time).stop) * 0.5;
      }
      sprintf(buf,"%14.12e",RVar11);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&name,(anonymous_namespace)::dump_plane_name_abi_cxx11_,
                 DAT_00755a78 + (anonymous_namespace)::dump_plane_name_abi_cxx11_);
      std::__cxx11::string::append((char *)&name);
      std::__cxx11::string::append((char *)&name);
      std::ofstream::ofstream(&ofs);
      std::ofstream::open((char *)&ofs,(_Ios_Openmode)name._M_dataplus._M_p);
      if (*(int *)((long)&local_3a8[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage +
                  *(long *)((long)_ofs + -0x18)) != 0) {
        amrex::FileOpenFailed(&name);
      }
      iVar6 = amrex::FabArrayBase::localindex((FabArrayBase *)&mf,0);
      amrex::FArrayBox::writeOn
                (mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar6],(ostream *)&ofs);
      _ofs = (double)_VTT;
      *(undefined8 *)(&ofs + *(long *)(_VTT + -0x18)) = __M_insert<void_const*>;
      std::filebuf::~filebuf((filebuf *)&pAStack_3b0);
      std::ios_base::~ios_base(local_2c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
    }
    amrex::MultiFab::~MultiFab(&mf);
    if (dm.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (dm.m_ref.
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    amrex::BoxArray::~BoxArray(&ba);
  }
  if (0 < avg_interval) {
    iVar6 = (this->super_AmrLevel).level;
    _ofs = (((this->super_AmrLevel).parent)->dt_level).super_vector<double,_std::allocator<double>_>
           .super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar6];
    time_average(this,time_avg.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar6,
                 time_avg_fluct.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar6,
                 dt_avg.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar6,(Real *)&ofs);
  }
  return;
}

Assistant:

void
NavierStokesBase::post_timestep (int crse_iteration)
{
  BL_PROFILE("NavierStokesBase::post_timestep()");

    const int finest_level = parent->finestLevel();

#ifdef AMREX_PARTICLES
    post_timestep_particle (crse_iteration);
#endif

    if (level == parent->finestLevel())
    {
        delete [] u_mac;
        u_mac = 0;
    }

    if (do_reflux && level < finest_level)
        reflux();

    //
    // Average everything down, including P and Gradp.
    // Even though the multilevel projections average down, only
    // single level projections have been done for current timestep.
    // The linearity of the average ensures that if we average down P
    // and Gp here, then we may simply add the incremental correction
    // (which get averaged down in amrex) during the sync projection.
    //
    // avgDown also updates rho_ctime since it's needed for rho_half,
    // which is used in the sync projection.
    //
    if (level < finest_level)
        avgDown();

    if (do_mac_proj && level < finest_level)
        mac_sync();

    if (do_sync_proj && (level < finest_level))
        level_sync(crse_iteration);


    //
    // Test for conservation.
    //
    if (level==0 && sum_interval>0 && (parent->levelSteps(0)%sum_interval == 0))
    {
        sum_integrated_quantities();
    }

    if (level > 0) incrPAvg();

    old_intersect_new          = grids;

    if (level == 0 && dump_plane >= 0)
    {
        Box bx = geom.Domain();

        AMREX_ASSERT(bx.bigEnd(AMREX_SPACEDIM-1) >= dump_plane);

        bx.setSmall(AMREX_SPACEDIM-1, dump_plane);
        bx.setBig  (AMREX_SPACEDIM-1, dump_plane);

        BoxArray ba(bx);
        DistributionMapping dm{ba};

        MultiFab mf(ba, dm, AMREX_SPACEDIM, 0, MFInfo(), Factory());

        mf.ParallelCopy(get_new_data(State_Type), Xvel, 0, AMREX_SPACEDIM);

        if (ParallelDescriptor::MyProc() == mf.DistributionMap()[0])
        {
            char buf[64];
            sprintf(buf, "%14.12e", state[State_Type].curTime());

            std::string name(dump_plane_name);
            name += buf;
            name += ".fab";

            std::ofstream ofs;
            ofs.open(name.c_str(),std::ios::out|std::ios::trunc|std::ios::binary);
            if (!ofs.good())
                amrex::FileOpenFailed(name);

            mf[0].writeOn(ofs);
        }
    }

    if (avg_interval > 0)
    {
      const amrex::Real dt_level = parent->dtLevel(level);
      time_average(time_avg[level], time_avg_fluct[level], dt_avg[level], dt_level);
    }

}